

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

basic_appender<char>
fmt::v11::detail::
write_significand<fmt::v11::basic_appender<char>,char,unsigned_int,fmt::v11::detail::digit_grouping<char>>
          (basic_appender<char> out,uint significand,int significand_size,int integral_size,
          char decimal_point,digit_grouping<char> *grouping)

{
  uint uVar1;
  basic_appender<char> bVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  basic_string_view<char> digits;
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> buffer;
  char local_253 [11];
  undefined8 local_248;
  long lStack_240;
  undefined8 local_238;
  code *local_230;
  undefined1 local_228 [504];
  
  if ((grouping->thousands_sep_)._M_string_length == 0) {
    if (decimal_point == '\0') {
      do_format_decimal<char,unsigned_int>((char *)&local_248,significand,significand_size);
      pcVar6 = (char *)((long)&local_248 + (long)significand_size);
    }
    else {
      pcVar6 = (char *)((long)&local_248 + (long)significand_size + 1);
      uVar3 = significand_size - integral_size;
      pcVar5 = pcVar6;
      if (1 < (int)uVar3) {
        iVar4 = (uVar3 >> 1) + 1;
        uVar1 = significand;
        do {
          significand = uVar1 / 100;
          *(undefined2 *)(pcVar5 + -2) =
               *(undefined2 *)(digits2(unsigned_long)::data + (ulong)(uVar1 % 100) * 2);
          pcVar5 = pcVar5 + -2;
          iVar4 = iVar4 + -1;
          uVar1 = uVar1 / 100;
        } while (1 < iVar4);
      }
      uVar1 = significand;
      if ((uVar3 & 1) != 0) {
        uVar1 = significand / 10;
        pcVar5[-1] = (char)significand + (char)(significand / 10) * -10 | 0x30;
        pcVar5 = pcVar5 + -1;
      }
      pcVar5[-1] = decimal_point;
      do_format_decimal<char,unsigned_int>(pcVar5 + (-1 - (long)integral_size),uVar1,integral_size);
    }
    bVar2 = copy_noinline<char,char*,fmt::v11::basic_appender<char>>((char *)&local_248,pcVar6,out);
  }
  else {
    lStack_240 = 0;
    local_230 = basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow;
    local_238 = 500;
    local_248 = local_228;
    if (decimal_point == '\0') {
      do_format_decimal<char,unsigned_int>(local_253,significand,significand_size);
      pcVar6 = local_253 + significand_size;
    }
    else {
      pcVar6 = local_253 + (long)significand_size + 1;
      uVar3 = significand_size - integral_size;
      pcVar5 = pcVar6;
      if (1 < (int)uVar3) {
        iVar4 = (uVar3 >> 1) + 1;
        uVar1 = significand;
        do {
          significand = uVar1 / 100;
          *(undefined2 *)(pcVar5 + -2) =
               *(undefined2 *)(digits2(unsigned_long)::data + (ulong)(uVar1 % 100) * 2);
          pcVar5 = pcVar5 + -2;
          iVar4 = iVar4 + -1;
          uVar1 = uVar1 / 100;
        } while (1 < iVar4);
      }
      uVar1 = significand;
      if ((uVar3 & 1) != 0) {
        uVar1 = significand / 10;
        pcVar5[-1] = (char)significand + (char)(significand / 10) * -10 | 0x30;
        pcVar5 = pcVar5 + -1;
      }
      pcVar5[-1] = decimal_point;
      do_format_decimal<char,unsigned_int>(pcVar5 + (-1 - (long)integral_size),uVar1,integral_size);
    }
    copy_noinline<char,char*,fmt::v11::basic_appender<char>>
              (local_253,pcVar6,(buffer<char> *)&local_248);
    digits.size_._0_4_ = integral_size;
    digits.data_ = local_248;
    digits.size_._4_4_ = 0;
    digit_grouping<char>::apply<fmt::v11::basic_appender<char>,char>(grouping,out,digits);
    bVar2 = copy_noinline<char,char*,fmt::v11::basic_appender<char>>
                      (local_248 + integral_size,local_248 + lStack_240,out);
    if (local_248 != local_228) {
      free(local_248);
    }
  }
  return (basic_appender<char>)bVar2.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int integral_size,
                                       Char decimal_point,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.has_separator()) {
    return write_significand(out, significand, significand_size, integral_size,
                             decimal_point);
  }
  auto buffer = basic_memory_buffer<Char>();
  write_significand(basic_appender<Char>(buffer), significand, significand_size,
                    integral_size, decimal_point);
  grouping.apply(
      out, basic_string_view<Char>(buffer.data(), to_unsigned(integral_size)));
  return detail::copy_noinline<Char>(buffer.data() + integral_size,
                                     buffer.end(), out);
}